

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int js_proxy_define_own_property
              (JSContext *ctx,JSValue obj,JSAtom prop,JSValue val,JSValue getter,JSValue setter,
              int flags)

{
  JSObject *p_00;
  JSValue getter_00;
  JSValue getter_01;
  JSValue setter_00;
  JSValue setter_01;
  JSValue setter_02;
  int iVar1;
  int iVar2;
  BOOL BVar3;
  JSRefCountHeader *p;
  JSProxyData *pJVar4;
  JSValueUnion JVar5;
  uint uVar6;
  char *fmt;
  JSValueUnion JVar7;
  JSValue v;
  JSValue func_obj;
  JSValue JVar8;
  JSValue JVar9;
  JSValue JVar10;
  JSValue val_00;
  JSValue val_01;
  JSValue val_02;
  JSRefCountHeader *p_4;
  JSRefCountHeader *p_3;
  JSPropertyDescriptor desc;
  JSValue method;
  uint local_f8;
  uint local_d8;
  uint local_d0;
  JSPropertyDescriptor local_b0;
  JSValueUnion local_78;
  int64_t local_70;
  JSValueUnion local_68;
  int64_t iStack_60;
  JSValue local_58;
  JSValue local_48;
  
  JVar7 = val.u;
  pJVar4 = get_proxy_method(ctx,(JSValue *)&local_78,obj,0x65);
  if (pJVar4 == (JSProxyData *)0x0) {
    return -1;
  }
  if ((uint)local_70 == 3) {
    iVar1 = JS_DefineProperty(ctx,pJVar4->target,prop,val,getter,setter,flags);
    return iVar1;
  }
  JVar8 = __JS_AtomToValue(ctx,prop,0);
  JVar5 = JVar8.u;
  uVar6 = (uint)JVar8.tag;
  if (uVar6 == 6) {
LAB_00143c28:
    if ((uint)local_70 < 0xfffffff5) {
      return -1;
    }
    iVar1 = *local_78.ptr;
    *(int *)local_78.ptr = iVar1 + -1;
    if (iVar1 < 2) {
      v.tag = local_70;
      v.u.ptr = local_78.ptr;
      __JS_FreeValueRT(ctx->rt,v);
      return -1;
    }
    return -1;
  }
  JVar9 = JS_NewObjectProtoClass(ctx,ctx->class_proto[1],1);
  if ((uint)JVar9.tag == 6) {
    if ((0xfffffff4 < uVar6) && (iVar1 = *JVar5.ptr, *(int *)JVar5.ptr = iVar1 + -1, iVar1 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar8);
    }
    goto LAB_00143c28;
  }
  if (((uint)flags >> 0xb & 1) != 0) {
    local_d0 = (uint)getter.tag;
    if (0xfffffff4 < local_d0) {
      *(int *)getter.u.ptr = *getter.u.ptr + 1;
    }
    JS_DefinePropertyValue(ctx,JVar9,0x41,getter,7);
  }
  if (((uint)flags >> 0xc & 1) != 0) {
    local_d8 = (uint)setter.tag;
    if (0xfffffff4 < local_d8) {
      *(int *)setter.u.ptr = *setter.u.ptr + 1;
    }
    JS_DefinePropertyValue(ctx,JVar9,0x42,setter,7);
  }
  if (((uint)flags >> 0xd & 1) != 0) {
    local_f8 = (uint)val.tag;
    if (0xfffffff4 < local_f8) {
      *(int *)JVar7.ptr = *JVar7.ptr + 1;
    }
    JS_DefinePropertyValue(ctx,JVar9,0x40,val,7);
  }
  if (((uint)flags >> 9 & 1) != 0) {
    val_00.u._0_4_ = (uint)flags >> 1 & 1;
    val_00.u._4_4_ = 0;
    local_b0.flags = 0;
    local_b0.value.u.float64 = 1.48219693752374e-323;
    local_68.float64 = local_68.float64 & 0xffffffff00000000;
    iStack_60 = 3;
    JVar10.tag = 3;
    JVar10.u.ptr = (void *)((ulong)(uint)local_b0._4_4_ << 0x20);
    setter_00.tag = 3;
    setter_00.u.ptr = local_68.ptr;
    val_00.tag = 1;
    JS_DefineProperty(ctx,JVar9,0x3e,val_00,JVar10,setter_00,0x2707);
  }
  if (((uint)flags >> 10 & 1) != 0) {
    val_01.u._0_4_ = (uint)flags >> 2 & 1;
    val_01.u._4_4_ = 0;
    local_b0.flags = 0;
    local_b0.value.u.float64 = 1.48219693752374e-323;
    local_68.float64 = local_68.float64 & 0xffffffff00000000;
    iStack_60 = 3;
    getter_00.tag = 3;
    getter_00.u.ptr = (void *)((ulong)(uint)local_b0._4_4_ << 0x20);
    setter_01.tag = 3;
    setter_01.u.ptr = local_68.ptr;
    val_01.tag = 1;
    JS_DefineProperty(ctx,JVar9,0x3f,val_01,getter_00,setter_01,0x2707);
  }
  if (((uint)flags >> 8 & 1) != 0) {
    val_02.u._0_4_ = flags & 1;
    val_02.u._4_4_ = 0;
    local_b0.flags = 0;
    local_b0.value.u.float64 = 1.48219693752374e-323;
    local_68.float64 = local_68.float64 & 0xffffffff00000000;
    iStack_60 = 3;
    getter_01.tag = 3;
    getter_01.u.ptr = (void *)((ulong)(uint)local_b0._4_4_ << 0x20);
    setter_02.tag = 3;
    setter_02.u.ptr = local_68.ptr;
    val_02.tag = 1;
    JS_DefineProperty(ctx,JVar9,0x3d,val_02,getter_01,setter_02,0x2707);
  }
  local_68.ptr = *(void **)&(pJVar4->target).u;
  iStack_60 = (pJVar4->target).tag;
  func_obj.tag = local_70;
  func_obj.u.float64 = local_78.float64;
  local_58 = JVar8;
  local_48 = JVar9;
  JVar10 = JS_CallFree(ctx,func_obj,pJVar4->handler,3,(JSValue *)&local_68);
  if ((0xfffffff4 < uVar6) && (iVar1 = *JVar5.ptr, *(int *)JVar5.ptr = iVar1 + -1, iVar1 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar8);
  }
  if ((0xfffffff4 < (uint)JVar9.tag) &&
     (iVar1 = *JVar9.u.ptr, *(int *)JVar9.u.ptr = iVar1 + -1, iVar1 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar9);
  }
  if ((int)JVar10.tag == 6) {
    return -1;
  }
  iVar1 = JS_ToBoolFree(ctx,JVar10);
  if (iVar1 == 0) {
    if (((uint)flags >> 0xe & 1) == 0) {
      return 0;
    }
    fmt = "proxy: defineProperty exception";
    goto LAB_00144058;
  }
  p_00 = (JSObject *)(pJVar4->target).u.ptr;
  iVar2 = JS_GetOwnPropertyInternal(ctx,&local_b0,p_00,prop);
  iVar1 = local_b0.flags;
  if (iVar2 < 0) {
    return -1;
  }
  if (iVar2 == 0) {
    if (((flags & 0x101U) != 0x100) && (((p_00->field_0).header.dummy1 & 1) != 0)) {
      return 1;
    }
  }
  else {
    BVar3 = check_define_prop_flags(local_b0.flags,flags);
    if ((BVar3 != 0) && (((flags & 0x101U) == 0x100 & (byte)iVar1) == 0)) {
      if ((flags & 0x1800U) == 0) {
        if (((uint)flags >> 0xd & 1) != 0) {
          if ((flags & 2U) == 0 && (iVar1 & 3U) == 2) goto LAB_0014402f;
          local_b0.setter.u = local_b0.value.u;
          setter.tag = val.tag;
          setter.u = JVar7;
          if ((iVar1 & 3U) == 0) goto LAB_00144140;
        }
      }
      else if ((iVar1 & 0x11U) == 0x10) {
        if (((uint)flags >> 0xb & 1) != 0) {
          BVar3 = js_same_value(ctx,getter,local_b0.getter);
          if (BVar3 == 0) goto LAB_0014402f;
        }
        local_b0.value.tag = local_b0.setter.tag;
        if (((uint)flags >> 0xc & 1) != 0) {
LAB_00144140:
          JVar8.tag = setter.tag;
          JVar8.u.ptr = setter.u.ptr;
          JVar9.tag = local_b0.value.tag;
          JVar9.u.float64 = local_b0.setter.u.float64;
          BVar3 = js_same_value(ctx,JVar8,JVar9);
          if (BVar3 == 0) goto LAB_0014402f;
        }
      }
      if ((((uint)flags >> 9 & 1) == 0) || ((local_b0.flags & 0x13U) != 2)) {
        js_free_desc(ctx,&local_b0);
        return 1;
      }
    }
LAB_0014402f:
    js_free_desc(ctx,&local_b0);
  }
  fmt = "proxy: inconsistent defineProperty";
LAB_00144058:
  JS_ThrowTypeError(ctx,fmt);
  return -1;
}

Assistant:

static int js_proxy_define_own_property(JSContext *ctx, JSValueConst obj,
                                        JSAtom prop, JSValueConst val,
                                        JSValueConst getter, JSValueConst setter,
                                        int flags)
{
    JSProxyData *s;
    JSValue method, ret1, prop_val, desc_val;
    int res, ret;
    JSObject *p;
    JSValueConst args[3];
    JSPropertyDescriptor desc;
    BOOL setting_not_configurable;

    s = get_proxy_method(ctx, &method, obj, JS_ATOM_defineProperty);
    if (!s)
        return -1;
    if (JS_IsUndefined(method)) {
        return JS_DefineProperty(ctx, s->target, prop, val, getter, setter, flags);
    }
    prop_val = JS_AtomToValue(ctx, prop);
    if (JS_IsException(prop_val)) {
        JS_FreeValue(ctx, method);
        return -1;
    }
    desc_val = js_create_desc(ctx, val, getter, setter, flags);
    if (JS_IsException(desc_val)) {
        JS_FreeValue(ctx, prop_val);
        JS_FreeValue(ctx, method);
        return -1;
    }
    args[0] = s->target;
    args[1] = prop_val;
    args[2] = desc_val;
    ret1 = JS_CallFree(ctx, method, s->handler, 3, args);
    JS_FreeValue(ctx, prop_val);
    JS_FreeValue(ctx, desc_val);
    if (JS_IsException(ret1))
        return -1;
    ret = JS_ToBoolFree(ctx, ret1);
    if (!ret) {
        if (flags & JS_PROP_THROW) {
            JS_ThrowTypeError(ctx, "proxy: defineProperty exception");
            return -1;
        } else {
            return 0;
        }
    }
    p = JS_VALUE_GET_OBJ(s->target);
    res = JS_GetOwnPropertyInternal(ctx, &desc, p, prop);
    if (res < 0)
        return -1;
    setting_not_configurable = ((flags & (JS_PROP_HAS_CONFIGURABLE |
                                          JS_PROP_CONFIGURABLE)) ==
                                JS_PROP_HAS_CONFIGURABLE);
    if (!res) {
        if (!p->extensible || setting_not_configurable)
            goto fail;
    } else {
        if (!check_define_prop_flags(desc.flags, flags) ||
            ((desc.flags & JS_PROP_CONFIGURABLE) && setting_not_configurable)) {
            goto fail1;
        }
        if (flags & (JS_PROP_HAS_GET | JS_PROP_HAS_SET)) {
            if ((desc.flags & (JS_PROP_GETSET | JS_PROP_CONFIGURABLE)) ==
                JS_PROP_GETSET) {
                if ((flags & JS_PROP_HAS_GET) &&
                    !js_same_value(ctx, getter, desc.getter)) {
                    goto fail1;
                }
                if ((flags & JS_PROP_HAS_SET) &&
                    !js_same_value(ctx, setter, desc.setter)) {
                    goto fail1;
                }
            }
        } else if (flags & JS_PROP_HAS_VALUE) {
            if ((desc.flags & (JS_PROP_CONFIGURABLE | JS_PROP_WRITABLE)) ==
                JS_PROP_WRITABLE && !(flags & JS_PROP_WRITABLE)) {
                /* missing-proxy-check feature */
                goto fail1;
            } else if ((desc.flags & (JS_PROP_CONFIGURABLE | JS_PROP_WRITABLE)) == 0 &&
                !js_same_value(ctx, val, desc.value)) {
                goto fail1;
            }
        }
        if (flags & JS_PROP_HAS_WRITABLE) {
            if ((desc.flags & (JS_PROP_GETSET | JS_PROP_CONFIGURABLE |
                               JS_PROP_WRITABLE)) == JS_PROP_WRITABLE) {
                /* proxy-missing-checks */
            fail1:
                js_free_desc(ctx, &desc);
            fail:
                JS_ThrowTypeError(ctx, "proxy: inconsistent defineProperty");
                return -1;
            }
        }
        js_free_desc(ctx, &desc);
    }
    return 1;
}